

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::anon_unknown_77::AsyncPipe::tryRead
          (AsyncPipe *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  long *plVar1;
  _func_int **pp_Var2;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *extraout_RDX_01;
  PromiseNode *pPVar3;
  _func_int *in_R8;
  Promise<unsigned_long> PVar4;
  Own<kj::_::AdapterPromiseNode<unsigned_long,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead>_>
  local_48;
  Own<kj::_::PromiseNode> local_38;
  
  if (maxBytes == 0) {
    Promise<unsigned_long>::Promise((Promise<unsigned_long> *)this,0);
    pPVar3 = extraout_RDX_00;
  }
  else {
    plVar1 = *(long **)((long)buffer + 0x20);
    if (plVar1 == (long *)0x0) {
      pp_Var2 = (_func_int **)operator_new(0x1d8);
      pp_Var2[1] = (_func_int *)0x0;
      *pp_Var2 = (_func_int *)&PTR_onReady_00430098;
      pp_Var2[2] = (_func_int *)&PTR_fulfill_004300e0;
      *(undefined1 *)(pp_Var2 + 3) = 0;
      *(undefined1 *)(pp_Var2 + 0x2f) = 0;
      *(undefined1 *)(pp_Var2 + 0x31) = 1;
      pp_Var2[0x32] = (_func_int *)&PTR_read_00430140;
      pp_Var2[0x33] = (_func_int *)&PTR_write_004301c0;
      pp_Var2[0x34] = (_func_int *)(pp_Var2 + 2);
      pp_Var2[0x35] = (_func_int *)buffer;
      pp_Var2[0x36] = (_func_int *)minBytes;
      pp_Var2[0x37] = in_R8;
      pp_Var2[0x38] = (_func_int *)maxBytes;
      pp_Var2[0x39] = (_func_int *)0x0;
      pp_Var2[0x3a] = (_func_int *)0x0;
      *(_func_int ***)((long)buffer + 0x20) = pp_Var2 + 0x32;
      local_48.disposer =
           (Disposer *)
           &_::
            HeapDisposer<kj::_::AdapterPromiseNode<unsigned_long,kj::(anonymous_namespace)::AsyncPipe::BlockedRead>>
            ::instance;
      local_38.disposer =
           (Disposer *)
           &_::
            HeapDisposer<kj::_::AdapterPromiseNode<unsigned_long,kj::(anonymous_namespace)::AsyncPipe::BlockedRead>>
            ::instance;
      local_48.ptr = (AdapterPromiseNode<unsigned_long,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead>
                      *)0x0;
      (this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream =
           (_func_int **)
           &_::
            HeapDisposer<kj::_::AdapterPromiseNode<unsigned_long,kj::(anonymous_namespace)::AsyncPipe::BlockedRead>>
            ::instance;
      (this->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream = pp_Var2;
      local_38.ptr = (PromiseNode *)0x0;
      Own<kj::_::PromiseNode>::dispose(&local_38);
      Own<kj::_::AdapterPromiseNode<unsigned_long,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead>_>
      ::~Own(&local_48);
      pPVar3 = extraout_RDX_01;
    }
    else {
      (**(code **)(*plVar1 + 8))(this,plVar1,minBytes,maxBytes);
      pPVar3 = extraout_RDX;
    }
  }
  PVar4.super_PromiseBase.node.ptr = pPVar3;
  PVar4.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<unsigned_long>)PVar4.super_PromiseBase.node;
}

Assistant:

Promise<size_t> tryRead(void* buffer, size_t minBytes, size_t maxBytes) override {
    if (minBytes == 0) {
      return size_t(0);
    } else KJ_IF_MAYBE(s, state) {
      return s->tryRead(buffer, minBytes, maxBytes);
    } else {
      return newAdaptedPromise<size_t, BlockedRead>(
          *this, arrayPtr(reinterpret_cast<byte*>(buffer), maxBytes), minBytes);
    }